

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cpp
# Opt level: O0

void __thiscall
RegJson_CreateBorderRouterFromBorderAgent_Test::TestBody
          (RegJson_CreateBorderRouterFromBorderAgent_Test *this)

{
  Status SVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R9;
  string local_3048;
  AssertHelper local_3028;
  Message local_3020;
  bool local_3011;
  undefined1 local_3010 [8];
  AssertionResult gtest_ar__48;
  AssertHelper local_2fe0;
  Message local_2fd8;
  bool local_2fc9;
  undefined1 local_2fc8 [8];
  AssertionResult gtest_ar__47;
  AssertHelper local_2f98;
  Message local_2f90;
  bool local_2f81;
  undefined1 local_2f80 [8];
  AssertionResult gtest_ar__46;
  Network nwk_4;
  AssertHelper local_2ef0;
  Message local_2ee8;
  bool local_2ed9;
  undefined1 local_2ed8 [8];
  AssertionResult gtest_ar__45;
  AssertHelper local_2ea8;
  Message local_2ea0;
  BorderRouterId local_2e98;
  bool local_2e91;
  undefined1 local_2e90 [8];
  AssertionResult gtest_ar__44;
  BorderRouter new_val_3;
  AssertHelper local_2cd8;
  Message local_2cd0;
  bool local_2cc1;
  undefined1 local_2cc0 [8];
  AssertionResult gtest_ar__43;
  allocator local_2ca1;
  string local_2ca0;
  allocator local_2c79;
  string local_2c78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2c58;
  allocator local_2c31;
  string local_2c30;
  Timestamp local_2c10;
  allocator local_2c01;
  string local_2c00;
  allocator local_2bd9;
  string local_2bd8;
  allocator local_2bb1;
  string local_2bb0;
  State local_2b90;
  allocator local_2b89;
  string local_2b88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b68;
  allocator local_2b49;
  string local_2b48;
  undefined1 local_2b28 [8];
  BorderAgent ba_6;
  AssertHelper local_2990;
  Message local_2988;
  bool local_2979;
  undefined1 local_2978 [8];
  AssertionResult gtest_ar__42;
  AssertHelper local_2948;
  Message local_2940;
  bool local_2931;
  undefined1 local_2930 [8];
  AssertionResult gtest_ar__41;
  Network nwk_3;
  AssertHelper local_28a0;
  Message local_2898;
  bool local_2889;
  undefined1 local_2888 [8];
  AssertionResult gtest_ar__40;
  AssertHelper local_2858;
  Message local_2850;
  BorderRouterId local_2848;
  bool local_2841;
  undefined1 local_2840 [8];
  AssertionResult gtest_ar__39;
  BorderRouter new_val_2;
  AssertHelper local_2688;
  Message local_2680;
  bool local_2671;
  undefined1 local_2670 [8];
  AssertionResult gtest_ar__38;
  allocator local_2651;
  string local_2650;
  allocator local_2629;
  string local_2628;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2608;
  allocator local_25e1;
  string local_25e0;
  Timestamp local_25c0;
  allocator local_25b1;
  string local_25b0;
  allocator local_2589;
  string local_2588;
  allocator local_2561;
  string local_2560;
  State local_2540;
  allocator local_2539;
  string local_2538;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2518;
  allocator local_24f9;
  string local_24f8;
  undefined1 local_24d8 [8];
  BorderAgent ba_5;
  AssertHelper local_2340;
  Message local_2338;
  bool local_2329;
  undefined1 local_2328 [8];
  AssertionResult gtest_ar__37;
  AssertHelper local_22f8;
  Message local_22f0;
  BorderRouterId local_22e8;
  bool local_22e1;
  undefined1 local_22e0 [8];
  AssertionResult gtest_ar__36;
  BorderRouter new_val_1;
  AssertHelper local_2128;
  Message local_2120;
  bool local_2111;
  undefined1 local_2110 [8];
  AssertionResult gtest_ar__35;
  allocator local_20f1;
  string local_20f0;
  allocator local_20c9;
  string local_20c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20a8;
  allocator local_2081;
  string local_2080;
  Timestamp local_2060;
  allocator local_2051;
  string local_2050;
  allocator local_2029;
  string local_2028;
  allocator local_2001;
  string local_2000;
  State local_1fe0;
  allocator local_1fd9;
  string local_1fd8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1fb8;
  allocator local_1f91;
  string local_1f90;
  undefined1 local_1f70 [8];
  BorderAgent ba_4;
  AssertHelper local_1dd8;
  Message local_1dd0;
  bool local_1dc1;
  undefined1 local_1dc0 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_1d90;
  Message local_1d88;
  bool local_1d79;
  undefined1 local_1d78 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_1d48;
  Message local_1d40;
  bool local_1d31;
  undefined1 local_1d30 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_1d00;
  Message local_1cf8;
  bool local_1ce9;
  undefined1 local_1ce8 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_1cb8;
  Message local_1cb0;
  bool local_1ca1;
  undefined1 local_1ca0 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_1c70;
  Message local_1c68;
  bool local_1c59;
  undefined1 local_1c58 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_1c28;
  Message local_1c20;
  bool local_1c11;
  undefined1 local_1c10 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_1be0;
  Message local_1bd8;
  bool local_1bc9;
  undefined1 local_1bc8 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_1b98;
  Message local_1b90;
  bool local_1b81;
  undefined1 local_1b80 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_1b50;
  Message local_1b48;
  bool local_1b39;
  undefined1 local_1b38 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_1b08;
  Message local_1b00;
  bool local_1af1;
  undefined1 local_1af0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_1ac0;
  Message local_1ab8;
  bool local_1aa9;
  undefined1 local_1aa8 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_1a78;
  Message local_1a70;
  bool local_1a61;
  undefined1 local_1a60 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_1a30;
  Message local_1a28;
  bool local_1a19;
  undefined1 local_1a18 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_19e8;
  Message local_19e0;
  BorderRouterId local_19d8;
  bool local_19d1;
  undefined1 local_19d0 [8];
  AssertionResult gtest_ar__20;
  BorderRouter new_val;
  AssertHelper local_1818;
  Message local_1810;
  bool local_1801;
  undefined1 local_1800 [8];
  AssertionResult gtest_ar__19;
  allocator local_17e1;
  string local_17e0;
  allocator local_17b9;
  string local_17b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1798;
  allocator local_1771;
  string local_1770;
  Timestamp local_1750;
  allocator local_1741;
  string local_1740;
  allocator local_1719;
  string local_1718;
  allocator local_16f1;
  string local_16f0;
  State local_16d0;
  allocator local_16c9;
  string local_16c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_16a8;
  allocator local_1689;
  string local_1688;
  undefined1 local_1668 [8];
  BorderAgent ba_3;
  AssertHelper local_14d0;
  Message local_14c8;
  bool local_14b9;
  undefined1 local_14b8 [8];
  AssertionResult gtest_ar__18;
  Network nwk_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1408;
  string local_13e8;
  AssertHelper local_13c8;
  Message local_13c0;
  bool local_13b1;
  undefined1 local_13b0 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_1380;
  Message local_1378;
  bool local_1369;
  undefined1 local_1368 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_1338;
  Message local_1330;
  BorderRouterId local_1328;
  bool local_1321;
  undefined1 local_1320 [8];
  AssertionResult gtest_ar__15;
  BorderRouter val;
  AssertHelper local_1168;
  Message local_1160;
  bool local_1151;
  undefined1 local_1150 [8];
  AssertionResult gtest_ar__14;
  allocator local_1131;
  string local_1130;
  allocator local_1109;
  string local_1108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_10e8;
  allocator local_10c1;
  string local_10c0;
  Timestamp local_10a0;
  allocator local_1091;
  string local_1090;
  allocator local_1069;
  string local_1068;
  allocator local_1041;
  string local_1040;
  State local_1020;
  allocator local_1019;
  string local_1018;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_ff8;
  allocator local_fd1;
  string local_fd0;
  undefined1 local_fb0 [8];
  BorderAgent ba_2;
  AssertHelper local_e18;
  Message local_e10;
  bool local_e01;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_dd0;
  Message local_dc8;
  bool local_db9;
  undefined1 local_db8 [8];
  AssertionResult gtest_ar__12;
  string dom;
  AssertHelper local_d68;
  Message local_d60;
  bool local_d51;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_d20;
  Message local_d18;
  bool local_d09;
  undefined1 local_d08 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_cd8;
  Message local_cd0;
  bool local_cc1;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar__9;
  Network nwk_1;
  AssertHelper local_c30;
  Message local_c28;
  bool local_c19;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_be8;
  Message local_be0;
  BorderRouterId local_bd8;
  bool local_bd1;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar__7;
  BorderRouter ret_val_1;
  AssertHelper local_a18;
  Message local_a10;
  bool local_a01;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar__6;
  allocator local_9e1;
  string local_9e0;
  allocator local_9b9;
  string local_9b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_998;
  allocator local_971;
  string local_970;
  Timestamp local_950;
  allocator local_941;
  string local_940;
  allocator local_919;
  string local_918;
  allocator local_8f1;
  string local_8f0;
  State local_8d0;
  allocator local_8c9;
  string local_8c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_8a8;
  allocator local_889;
  string local_888;
  undefined1 local_868 [8];
  BorderAgent ba_1;
  AssertHelper local_6d0;
  Message local_6c8;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_688;
  Message local_680;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__4;
  Network nwk;
  AssertHelper local_5e0;
  Message local_5d8;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_598;
  Message local_590;
  BorderRouterId local_588;
  bool local_581;
  undefined1 local_580 [8];
  AssertionResult gtest_ar__2;
  BorderRouter ret_val;
  AssertHelper local_3c8;
  Message local_3c0;
  bool local_3b1;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__1;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_348;
  allocator local_321;
  string local_320;
  Timestamp local_300;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  State local_280;
  allocator local_279;
  string local_278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  allocator local_239;
  string local_238;
  undefined1 local_218 [8];
  BorderAgent ba;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  Registry reg;
  RegJson_CreateBorderRouterFromBorderAgent_Test *this_local;
  
  reg.mStorage = (PersistentStorage *)this;
  unlink("./tmp/registry_test.json");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"./tmp/registry_test.json",&local_41);
  ot::commissioner::persistent_storage::Registry::Registry((Registry *)local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  SVar1 = ot::commissioner::persistent_storage::Registry::Open((Registry *)local_20);
  local_69 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba.mPresentFlags,(internal *)local_68,
               (AssertionResult *)"reg.Open() == Registry::Status::kSuccess","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&ba.mPresentFlags);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"1.1.1.1",&local_239);
  local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,anon_var_dwarf_36a810 + 9,&local_279);
  ot::commissioner::BorderAgent::State::State(&local_280,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"net1",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,anon_var_dwarf_36a810 + 9,&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,anon_var_dwarf_36a810 + 9,&local_2f1);
  local_300 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,anon_var_dwarf_36a810 + 9,&local_321);
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,anon_var_dwarf_36a810 + 9,&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,anon_var_dwarf_36a810 + 9,&local_391);
  ot::commissioner::UnixTime::UnixTime((UnixTime *)&gtest_ar__1.message_,0);
  pcVar3 = (char *)(ulong)(uint)local_280;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_218,&local_238,1,&local_258,&local_278,local_280,&local_2a0,
             0x101010101010101,&local_2c8,&local_2f0,local_300,0,&local_320,&local_348,&local_368,
             '\0',0,&local_390,
             (UnixTime)
             gtest_ar__1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,0x33);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_348);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add
                    ((Registry *)local_20,(BorderAgent *)local_218);
  local_3b1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b0,&local_3b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val.mAgent.mPresentFlags,(internal *)local_3b0,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar3)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    std::__cxx11::string::~string((string *)&ret_val.mAgent.mPresentFlags);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__2.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_588,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    ((Registry *)local_20,local_588,(BorderRouter *)&gtest_ar__2.message_);
  local_581 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_580,&local_581,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar2) {
    testing::Message::Message(&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_580,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, ret_val) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  local_5c9 = ret_val._vptr_BorderRouter._4_4_ == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar2) {
    testing::Message::Message(&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk.mCcm,(internal *)local_5c8,
               (AssertionResult *)"ret_val.mNetworkId.mId == 0","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    std::__cxx11::string::~string((string *)&nwk.mCcm);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar__4.message_);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
                    ((Registry *)local_20,0,(Network *)&gtest_ar__4.message_);
  local_671 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_670,&local_671,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar2) {
    testing::Message::Message(&local_680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_670,
               (AssertionResult *)"reg.GetNetworkByXpan(0, nwk) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6b9 = gtest_ar__4.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar2) {
    testing::Message::Message(&local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba_1.mPresentFlags,(internal *)local_6b8,
               (AssertionResult *)"nwk.mDomainId.mId == EMPTY_ID","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&ba_1.mPresentFlags);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar__4.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__2.message_);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_888,"1.1.1.2",&local_889);
  local_8a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c8,anon_var_dwarf_36a810 + 9,&local_8c9);
  ot::commissioner::BorderAgent::State::State(&local_8d0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f0,"net2",&local_8f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_918,anon_var_dwarf_36a810 + 9,&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_940,anon_var_dwarf_36a810 + 9,&local_941);
  local_950 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_970,anon_var_dwarf_36a810 + 9,&local_971);
  local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9b8,"dom2",&local_9b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9e0,anon_var_dwarf_36a810 + 9,&local_9e1);
  ot::commissioner::UnixTime::UnixTime((UnixTime *)&gtest_ar__6.message_,0);
  pcVar3 = (char *)(ulong)(uint)local_8d0;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_868,&local_888,2,&local_8a8,&local_8c8,local_8d0,&local_8f0,
             0x202020202020202,&local_918,&local_940,local_950,0,&local_970,&local_998,&local_9b8,
             '\0',0,&local_9e0,
             (UnixTime)
             gtest_ar__6.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,0x1033);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_998);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator((allocator<char> *)&local_941);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add
                    ((Registry *)local_20,(BorderAgent *)local_868);
  local_a01 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a00,&local_a01,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar2) {
    testing::Message::Message(&local_a10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val_1.mAgent.mPresentFlags,(internal *)local_a00,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar3)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a18,&local_a10);
    testing::internal::AssertHelper::~AssertHelper(&local_a18);
    std::__cxx11::string::~string((string *)&ret_val_1.mAgent.mPresentFlags);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_bd8,1);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    ((Registry *)local_20,local_bd8,(BorderRouter *)&gtest_ar__7.message_);
  local_bd1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bd0,&local_bd1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
  if (!bVar2) {
    testing::Message::Message(&local_be0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_bd0,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{1}, ret_val) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_be8,&local_be0);
    testing::internal::AssertHelper::~AssertHelper(&local_be8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
  local_c19 = ret_val_1._vptr_BorderRouter._4_4_ == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c18,&local_c19,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar2) {
    testing::Message::Message(&local_c28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk_1.mCcm,(internal *)local_c18,
               (AssertionResult *)"ret_val.mNetworkId.mId == 1","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c30,&local_c28);
    testing::internal::AssertHelper::~AssertHelper(&local_c30);
    std::__cxx11::string::~string((string *)&nwk_1.mCcm);
    testing::Message::~Message(&local_c28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar__9.message_);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    ((Registry *)local_20,(string *)&ba_1.mState,(Network *)&gtest_ar__9.message_);
  local_cc1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cc0,&local_cc1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
  if (!bVar2) {
    testing::Message::Message(&local_cd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_cc0,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_cd8,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper(&local_cd8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
  local_d09 = (int)gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d08,&local_d09,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d08);
  if (!bVar2) {
    testing::Message::Message(&local_d18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_d08,
               (AssertionResult *)"nwk.mId.mId == 1","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d20,&local_d18);
    testing::internal::AssertHelper::~AssertHelper(&local_d20);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_d18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d08);
  local_d51 = gtest_ar__9.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d50,&local_d51,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar2) {
    testing::Message::Message(&local_d60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&dom.field_2 + 8),(internal *)local_d50,
               (AssertionResult *)"nwk.mDomainId.mId == 0","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x80,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d68,&local_d60);
    testing::internal::AssertHelper::~AssertHelper(&local_d68);
    std::__cxx11::string::~string((string *)(dom.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_d60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  std::__cxx11::string::string((string *)&gtest_ar__12.message_);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetDomainNameByXpan
                    ((Registry *)local_20,nwk_1.mName.field_2._8_8_,(string *)&gtest_ar__12.message_
                    );
  local_db9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_db8,&local_db9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
  if (!bVar2) {
    testing::Message::Message(&local_dc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_db8,
               (AssertionResult *)
               "reg.GetDomainNameByXpan(nwk.mXpan, dom) == Registry::Status::kSuccess","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=(&local_dd0,&local_dc8);
    testing::internal::AssertHelper::~AssertHelper(&local_dd0);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
  local_e01 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &gtest_ar__12.message_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ba_1.mVendorOui.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e00,&local_e01,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
  if (!bVar2) {
    testing::Message::Message(&local_e10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba_2.mPresentFlags,(internal *)local_e00,
               (AssertionResult *)"dom == ba.mDomainName","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e18,&local_e10);
    testing::internal::AssertHelper::~AssertHelper(&local_e18);
    std::__cxx11::string::~string((string *)&ba_2.mPresentFlags);
    testing::Message::~Message(&local_e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
  std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar__9.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__7.message_);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fd0,"1.1.1.1",&local_fd1);
  local_ff8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ff8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ff8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_ff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1018,anon_var_dwarf_36a810 + 9,&local_1019);
  ot::commissioner::BorderAgent::State::State(&local_1020,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1040,anon_var_dwarf_36a810 + 9,&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1068,"vendorName",&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1090,anon_var_dwarf_36a810 + 9,&local_1091);
  local_10a0 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10c0,anon_var_dwarf_36a810 + 9,&local_10c1);
  local_10e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_10e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1108,anon_var_dwarf_36a810 + 9,&local_1109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1130,anon_var_dwarf_36a810 + 9,&local_1131);
  ot::commissioner::UnixTime::UnixTime((UnixTime *)&gtest_ar__14.message_,0);
  pcVar3 = (char *)(ulong)(uint)local_1020;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_fb0,&local_fd0,1,&local_ff8,&local_1018,local_1020,&local_1040,0,
             &local_1068,&local_1090,local_10a0,0,&local_10c0,&local_10e8,&local_1108,'\0',0,
             &local_1130,
             (UnixTime)
             gtest_ar__14.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,0x43);
  std::__cxx11::string::~string((string *)&local_1130);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_10e8);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
  std::__cxx11::string::~string((string *)&local_1090);
  std::allocator<char>::~allocator((allocator<char> *)&local_1091);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator((allocator<char> *)&local_1069);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator((allocator<char> *)&local_1019);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_ff8);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add
                    ((Registry *)local_20,(BorderAgent *)local_fb0);
  local_1151 = SVar1 == kError;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1150,&local_1151,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1150);
  if (!bVar2) {
    testing::Message::Message(&local_1160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&val.mAgent.mPresentFlags,(internal *)local_1150,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kError","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x9c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1168,&local_1160);
    testing::internal::AssertHelper::~AssertHelper(&local_1168);
    std::__cxx11::string::~string((string *)&val.mAgent.mPresentFlags);
    testing::Message::~Message(&local_1160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1150);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_fb0);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__15.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_1328,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    ((Registry *)local_20,local_1328,(BorderRouter *)&gtest_ar__15.message_);
  local_1321 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1320,&local_1321,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1320);
  if (!bVar2) {
    testing::Message::Message(&local_1330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_1320,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, val) == Registry::Status::kSuccess","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1338,&local_1330);
    testing::internal::AssertHelper::~AssertHelper(&local_1338);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_1330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1320);
  local_1369 = (~(uint)val.mAgent.mUpdateTimestamp.mTime & 3) == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1368,&local_1369,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1368);
  if (!bVar2) {
    testing::Message::Message(&local_1378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_1368,
               (AssertionResult *)
               "(val.mAgent.mPresentFlags & (BorderAgent::kAddrBit | BorderAgent::kPortBit)) == (BorderAgent::kAddrBit | BorderAgent::kPortBit)"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1380,&local_1378);
    testing::internal::AssertHelper::~AssertHelper(&local_1380);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_1378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
  local_13b1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &val.mAgent,"1.1.1.1");
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_13b0,&local_13b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13b0);
  if (!bVar2) {
    testing::Message::Message(&local_13c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13e8,(internal *)local_13b0,
               (AssertionResult *)"val.mAgent.mAddr == \"1.1.1.1\"","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_13c8,&local_13c0);
    testing::internal::AssertHelper::~AssertHelper(&local_13c8);
    std::__cxx11::string::~string((string *)&local_13e8);
    testing::Message::~Message(&local_13c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13b0);
  std::operator+(&local_1428,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &val.mAgent.mState," : ");
  ot::commissioner::utils::Hex<unsigned_long>
            ((string *)&nwk_2.mCcm,val.mAgent.mNetworkName.field_2._8_8_);
  std::operator+(&local_1408,&local_1428,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nwk_2.mCcm);
  ot::commissioner::Console::Write(&local_1408,kDefault);
  std::__cxx11::string::~string((string *)&local_1408);
  std::__cxx11::string::~string((string *)&nwk_2.mCcm);
  std::__cxx11::string::~string((string *)&local_1428);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar__18.message_);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
                    ((Registry *)local_20,val.mAgent.mNetworkName.field_2._8_8_,
                     (Network *)&gtest_ar__18.message_);
  local_14b9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_14b8,&local_14b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b8);
  if (!bVar2) {
    testing::Message::Message(&local_14c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba_3.mPresentFlags,(internal *)local_14b8,
               (AssertionResult *)
               "reg.GetNetworkByXpan(val.mAgent.mExtendedPanId, nwk) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_14d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_14d0,&local_14c8);
    testing::internal::AssertHelper::~AssertHelper(&local_14d0);
    std::__cxx11::string::~string((string *)&ba_3.mPresentFlags);
    testing::Message::~Message(&local_14c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1688,"1.1.1.1",&local_1689);
  local_16a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_16a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16c8,anon_var_dwarf_36a810 + 9,&local_16c9);
  ot::commissioner::BorderAgent::State::State(&local_16d0,3,2,1,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16f0,"net1",&local_16f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1718,"vendorName",&local_1719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1740,anon_var_dwarf_36a810 + 9,&local_1741);
  local_1750 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1770,"vendorData",&local_1771);
  local_1798.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1798.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1798.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17b8,anon_var_dwarf_36a810 + 9,&local_17b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17e0,anon_var_dwarf_36a810 + 9,&local_17e1);
  ot::commissioner::UnixTime::UnixTime((UnixTime *)&gtest_ar__19.message_,0);
  pcVar3 = (char *)(ulong)(uint)local_16d0;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_1668,&local_1688,1,&local_16a8,&local_16c8,local_16d0,&local_16f0,
             0x101010101010101,&local_1718,&local_1740,local_1750,0,&local_1770,&local_1798,
             &local_17b8,'\0',0,&local_17e0,
             (UnixTime)
             gtest_ar__19.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,0x47b);
  std::__cxx11::string::~string((string *)&local_17e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
  std::__cxx11::string::~string((string *)&local_17b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1798);
  std::__cxx11::string::~string((string *)&local_1770);
  std::allocator<char>::~allocator((allocator<char> *)&local_1771);
  std::__cxx11::string::~string((string *)&local_1740);
  std::allocator<char>::~allocator((allocator<char> *)&local_1741);
  std::__cxx11::string::~string((string *)&local_1718);
  std::allocator<char>::~allocator((allocator<char> *)&local_1719);
  std::__cxx11::string::~string((string *)&local_16f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f1);
  std::__cxx11::string::~string((string *)&local_16c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_16a8);
  std::__cxx11::string::~string((string *)&local_1688);
  std::allocator<char>::~allocator((allocator<char> *)&local_1689);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add
                    ((Registry *)local_20,(BorderAgent *)local_1668);
  local_1801 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1800,&local_1801,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1800);
  if (!bVar2) {
    testing::Message::Message(&local_1810);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&new_val.mAgent.mPresentFlags,(internal *)local_1800,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar3)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1818,&local_1810);
    testing::internal::AssertHelper::~AssertHelper(&local_1818);
    std::__cxx11::string::~string((string *)&new_val.mAgent.mPresentFlags);
    testing::Message::~Message(&local_1810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1800);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__20.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_19d8,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    ((Registry *)local_20,local_19d8,(BorderRouter *)&gtest_ar__20.message_);
  local_19d1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_19d0,&local_19d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19d0);
  if (!bVar2) {
    testing::Message::Message(&local_19e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_19d0,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_19e8,&local_19e0);
    testing::internal::AssertHelper::~AssertHelper(&local_19e8);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_19e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19d0);
  local_1a19 = (int)val._vptr_BorderRouter == (int)new_val._vptr_BorderRouter;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a18,&local_1a19,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a18);
  if (!bVar2) {
    testing::Message::Message(&local_1a28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_1a18,
               (AssertionResult *)"val.mId.mId == new_val.mId.mId","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a30,&local_1a28);
    testing::internal::AssertHelper::~AssertHelper(&local_1a30);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_1a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a18);
  local_1a61 = val._vptr_BorderRouter._4_4_ == new_val._vptr_BorderRouter._4_4_;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a60,&local_1a61,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a60);
  if (!bVar2) {
    testing::Message::Message(&local_1a70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_1a60,
               (AssertionResult *)"val.mNetworkId.mId == new_val.mNetworkId.mId","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a78,&local_1a70);
    testing::internal::AssertHelper::~AssertHelper(&local_1a78);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_1a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a60);
  local_1aa9 = SUB41(((uint)new_val.mAgent.mUpdateTimestamp.mTime & 8) >> 3,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1aa8,&local_1aa9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1aa8);
  if (!bVar2) {
    testing::Message::Message(&local_1ab8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_1aa8,
               (AssertionResult *)"(new_val.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1ac0,&local_1ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ac0);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_1ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1aa8);
  local_1af1 = (new_val.mAgent.mThreadVersion.field_2._8_2_ & 7) ==
               (ba_3.mThreadVersion.field_2._8_2_ & 7);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1af0,&local_1af1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1af0);
  if (!bVar2) {
    testing::Message::Message(&local_1b00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_1af0,
               (AssertionResult *)
               "new_val.mAgent.mState.mConnectionMode == ba.mState.mConnectionMode","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,199,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b08,&local_1b00);
    testing::internal::AssertHelper::~AssertHelper(&local_1b08);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_1b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1af0);
  local_1b39 = ((ushort)new_val.mAgent.mThreadVersion.field_2._8_2_ >> 3 & 3) ==
               ((ushort)ba_3.mThreadVersion.field_2._8_2_ >> 3 & 3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b38,&local_1b39,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b38);
  if (!bVar2) {
    testing::Message::Message(&local_1b48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_1b38,
               (AssertionResult *)
               "new_val.mAgent.mState.mThreadIfStatus == ba.mState.mThreadIfStatus","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,200,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b50,&local_1b48);
    testing::internal::AssertHelper::~AssertHelper(&local_1b50);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_1b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b38);
  local_1b81 = ((ushort)new_val.mAgent.mThreadVersion.field_2._8_2_ >> 5 & 3) ==
               ((ushort)ba_3.mThreadVersion.field_2._8_2_ >> 5 & 3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b80,&local_1b81,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b80);
  if (!bVar2) {
    testing::Message::Message(&local_1b90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_1b80,
               (AssertionResult *)"new_val.mAgent.mState.mAvailability == ba.mState.mAvailability",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b98,&local_1b90);
    testing::internal::AssertHelper::~AssertHelper(&local_1b98);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_1b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b80);
  local_1bc9 = SUB41(((uint)new_val.mAgent.mUpdateTimestamp.mTime & 0x10) >> 4,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1bc8,&local_1bc9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bc8);
  if (!bVar2) {
    testing::Message::Message(&local_1bd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_1bc8,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kNetworkNameBit) != 0","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1be0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xca,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1be0,&local_1bd8);
    testing::internal::AssertHelper::~AssertHelper(&local_1be0);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_1bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bc8);
  local_1c11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &new_val.mAgent.mState,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ba_3.mState);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c10,&local_1c11,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c10);
  if (!bVar2) {
    testing::Message::Message(&local_1c20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_1c10,
               (AssertionResult *)"new_val.mAgent.mNetworkName == ba.mNetworkName","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c28,&local_1c20);
    testing::internal::AssertHelper::~AssertHelper(&local_1c28);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_1c20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c10);
  local_1c59 = SUB41(((uint)new_val.mAgent.mUpdateTimestamp.mTime & 0x20) >> 5,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c58,&local_1c59,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c58);
  if (!bVar2) {
    testing::Message::Message(&local_1c68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_1c58,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0","false","true"
               ,pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c70,&local_1c68);
    testing::internal::AssertHelper::~AssertHelper(&local_1c70);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_1c68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c58);
  local_1ca1 = new_val.mAgent.mNetworkName.field_2._8_8_ == ba_3.mNetworkName.field_2._8_8_;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ca0,&local_1ca1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ca0);
  if (!bVar2) {
    testing::Message::Message(&local_1cb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_1ca0,
               (AssertionResult *)"new_val.mAgent.mExtendedPanId == ba.mExtendedPanId","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1cb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1cb8,&local_1cb0);
    testing::internal::AssertHelper::~AssertHelper(&local_1cb8);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_1cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ca0);
  local_1ce9 = SUB41(((uint)new_val.mAgent.mUpdateTimestamp.mTime & 0x40) >> 6,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ce8,&local_1ce9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ce8);
  if (!bVar2) {
    testing::Message::Message(&local_1cf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__32.message_,(internal *)local_1ce8,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xce,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d00,&local_1cf8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d00);
    std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_1cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ce8);
  local_1d31 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &new_val.mAgent.mExtendedPanId,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ba_3.mExtendedPanId);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d30,&local_1d31,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d30);
  if (!bVar2) {
    testing::Message::Message(&local_1d40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_1d30,
               (AssertionResult *)"new_val.mAgent.mVendorName == ba.mVendorName","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d48,&local_1d40);
    testing::internal::AssertHelper::~AssertHelper(&local_1d48);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_1d40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d30);
  local_1d79 = (bool)((byte)((uint)new_val.mAgent.mUpdateTimestamp.mTime >> 10) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d78,&local_1d79,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d78);
  if (!bVar2) {
    testing::Message::Message(&local_1d88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_1d78,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xd0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d90,&local_1d88);
    testing::internal::AssertHelper::~AssertHelper(&local_1d90);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_1d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d78);
  local_1dc1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &new_val.mAgent.mPartitionId,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ba_3.mPartitionId);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1dc0,&local_1dc1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1dc0);
  if (!bVar2) {
    testing::Message::Message(&local_1dd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba_4.mPresentFlags,(internal *)local_1dc0,
               (AssertionResult *)"new_val.mAgent.mVendorData == ba.mVendorData","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xd1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1dd8,&local_1dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_1dd8);
    std::__cxx11::string::~string((string *)&ba_4.mPresentFlags);
    testing::Message::~Message(&local_1dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1dc0);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__20.message_);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_1668);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar__18.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__15.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f90,"1.1.1.1",&local_1f91);
  local_1fb8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1fb8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1fb8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1fb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1fd8,anon_var_dwarf_36a810 + 9,&local_1fd9);
  ot::commissioner::BorderAgent::State::State(&local_1fe0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2000,"net3",&local_2001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2028,"vendorName",&local_2029);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2050,anon_var_dwarf_36a810 + 9,&local_2051);
  local_2060 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2080,anon_var_dwarf_36a810 + 9,&local_2081);
  local_20a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_20a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20c8,anon_var_dwarf_36a810 + 9,&local_20c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20f0,anon_var_dwarf_36a810 + 9,&local_20f1);
  ot::commissioner::UnixTime::UnixTime((UnixTime *)&gtest_ar__35.message_,0);
  pcVar3 = (char *)(ulong)(uint)local_1fe0;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_1f70,&local_1f90,1,&local_1fb8,&local_1fd8,local_1fe0,&local_2000,
             0x303030303030303,&local_2028,&local_2050,local_2060,0,&local_2080,&local_20a8,
             &local_20c8,'\0',0,&local_20f0,
             (UnixTime)
             gtest_ar__35.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,0x73);
  std::__cxx11::string::~string((string *)&local_20f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20f1);
  std::__cxx11::string::~string((string *)&local_20c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_20a8);
  std::__cxx11::string::~string((string *)&local_2080);
  std::allocator<char>::~allocator((allocator<char> *)&local_2081);
  std::__cxx11::string::~string((string *)&local_2050);
  std::allocator<char>::~allocator((allocator<char> *)&local_2051);
  std::__cxx11::string::~string((string *)&local_2028);
  std::allocator<char>::~allocator((allocator<char> *)&local_2029);
  std::__cxx11::string::~string((string *)&local_2000);
  std::allocator<char>::~allocator((allocator<char> *)&local_2001);
  std::__cxx11::string::~string((string *)&local_1fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fd9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1fb8);
  std::__cxx11::string::~string((string *)&local_1f90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f91);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add
                    ((Registry *)local_20,(BorderAgent *)local_1f70);
  local_2111 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2110,&local_2111,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2110);
  if (!bVar2) {
    testing::Message::Message(&local_2120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&new_val_1.mAgent.mPresentFlags,(internal *)local_2110,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar3)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xeb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2128,&local_2120);
    testing::internal::AssertHelper::~AssertHelper(&local_2128);
    std::__cxx11::string::~string((string *)&new_val_1.mAgent.mPresentFlags);
    testing::Message::~Message(&local_2120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2110);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__36.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_22e8,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    ((Registry *)local_20,local_22e8,(BorderRouter *)&gtest_ar__36.message_);
  local_22e1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_22e0,&local_22e1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22e0);
  if (!bVar2) {
    testing::Message::Message(&local_22f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__37.message_,(internal *)local_22e0,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_22f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xed,pcVar4);
    testing::internal::AssertHelper::operator=(&local_22f8,&local_22f0);
    testing::internal::AssertHelper::~AssertHelper(&local_22f8);
    std::__cxx11::string::~string((string *)&gtest_ar__37.message_);
    testing::Message::~Message(&local_22f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22e0);
  local_2329 = new_val_1._vptr_BorderRouter._4_4_ == 2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2328,&local_2329,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2328);
  if (!bVar2) {
    testing::Message::Message(&local_2338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba_5.mPresentFlags,(internal *)local_2328,
               (AssertionResult *)"new_val.mNetworkId.mId == 2","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2340,&local_2338);
    testing::internal::AssertHelper::~AssertHelper(&local_2340);
    std::__cxx11::string::~string((string *)&ba_5.mPresentFlags);
    testing::Message::~Message(&local_2338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2328);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__36.message_);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_1f70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_24f8,"1.1.1.1",&local_24f9);
  local_2518.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2518.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2518.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2538,anon_var_dwarf_36a810 + 9,&local_2539);
  ot::commissioner::BorderAgent::State::State(&local_2540,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2560,"net3",&local_2561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2588,"vendorName",&local_2589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_25b0,anon_var_dwarf_36a810 + 9,&local_25b1);
  local_25c0 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_25e0,anon_var_dwarf_36a810 + 9,&local_25e1);
  local_2608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2628,"dom2",&local_2629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2650,anon_var_dwarf_36a810 + 9,&local_2651);
  ot::commissioner::UnixTime::UnixTime((UnixTime *)&gtest_ar__38.message_,0);
  pcVar3 = (char *)(ulong)(uint)local_2540;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_24d8,&local_24f8,1,&local_2518,&local_2538,local_2540,&local_2560,
             0x303030303030303,&local_2588,&local_25b0,local_25c0,0,&local_25e0,&local_2608,
             &local_2628,'\0',0,&local_2650,
             (UnixTime)
             gtest_ar__38.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,0x1073);
  std::__cxx11::string::~string((string *)&local_2650);
  std::allocator<char>::~allocator((allocator<char> *)&local_2651);
  std::__cxx11::string::~string((string *)&local_2628);
  std::allocator<char>::~allocator((allocator<char> *)&local_2629);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2608);
  std::__cxx11::string::~string((string *)&local_25e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_25e1);
  std::__cxx11::string::~string((string *)&local_25b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_25b1);
  std::__cxx11::string::~string((string *)&local_2588);
  std::allocator<char>::~allocator((allocator<char> *)&local_2589);
  std::__cxx11::string::~string((string *)&local_2560);
  std::allocator<char>::~allocator((allocator<char> *)&local_2561);
  std::__cxx11::string::~string((string *)&local_2538);
  std::allocator<char>::~allocator((allocator<char> *)&local_2539);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2518);
  std::__cxx11::string::~string((string *)&local_24f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_24f9);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add
                    ((Registry *)local_20,(BorderAgent *)local_24d8);
  local_2671 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2670,&local_2671,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2670);
  if (!bVar2) {
    testing::Message::Message(&local_2680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&new_val_2.mAgent.mPresentFlags,(internal *)local_2670,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar3)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x108,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2688,&local_2680);
    testing::internal::AssertHelper::~AssertHelper(&local_2688);
    std::__cxx11::string::~string((string *)&new_val_2.mAgent.mPresentFlags);
    testing::Message::~Message(&local_2680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2670);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__39.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_2848,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    ((Registry *)local_20,local_2848,(BorderRouter *)&gtest_ar__39.message_);
  local_2841 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2840,&local_2841,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2840);
  if (!bVar2) {
    testing::Message::Message(&local_2850);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__40.message_,(internal *)local_2840,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2858,&local_2850);
    testing::internal::AssertHelper::~AssertHelper(&local_2858);
    std::__cxx11::string::~string((string *)&gtest_ar__40.message_);
    testing::Message::~Message(&local_2850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2840);
  local_2889 = new_val_2._vptr_BorderRouter._4_4_ == 2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2888,&local_2889,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2888);
  if (!bVar2) {
    testing::Message::Message(&local_2898);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk_3.mCcm,(internal *)local_2888,
               (AssertionResult *)"new_val.mNetworkId.mId == 2","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_28a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_28a0,&local_2898);
    testing::internal::AssertHelper::~AssertHelper(&local_28a0);
    std::__cxx11::string::~string((string *)&nwk_3.mCcm);
    testing::Message::~Message(&local_2898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2888);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar__41.message_);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    ((Registry *)local_20,(string *)&ba_5.mState,(Network *)&gtest_ar__41.message_);
  local_2931 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2930,&local_2931,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2930);
  if (!bVar2) {
    testing::Message::Message(&local_2940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__42.message_,(internal *)local_2930,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2948,&local_2940);
    testing::internal::AssertHelper::~AssertHelper(&local_2948);
    std::__cxx11::string::~string((string *)&gtest_ar__42.message_);
    testing::Message::~Message(&local_2940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2930);
  local_2979 = gtest_ar__41.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._4_4_ == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2978,&local_2979,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2978);
  if (!bVar2) {
    testing::Message::Message(&local_2988);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba_6.mPresentFlags,(internal *)local_2978,
               (AssertionResult *)"nwk.mDomainId.mId == 0","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2990,&local_2988);
    testing::internal::AssertHelper::~AssertHelper(&local_2990);
    std::__cxx11::string::~string((string *)&ba_6.mPresentFlags);
    testing::Message::~Message(&local_2988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2978);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar__41.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__39.message_);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_24d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b48,"1.1.1.1",&local_2b49);
  local_2b68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2b68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b88,anon_var_dwarf_36a810 + 9,&local_2b89);
  ot::commissioner::BorderAgent::State::State(&local_2b90,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2bb0,"net3",&local_2bb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2bd8,"vendorName",&local_2bd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c00,anon_var_dwarf_36a810 + 9,&local_2c01);
  local_2c10 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c30,anon_var_dwarf_36a810 + 9,&local_2c31);
  local_2c58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2c58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c78,"dom1",&local_2c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2ca0,anon_var_dwarf_36a810 + 9,&local_2ca1);
  ot::commissioner::UnixTime::UnixTime((UnixTime *)&gtest_ar__43.message_,0);
  pcVar3 = (char *)(ulong)(uint)local_2b90;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_2b28,&local_2b48,1,&local_2b68,&local_2b88,local_2b90,&local_2bb0,
             0x303030303030303,&local_2bd8,&local_2c00,local_2c10,0,&local_2c30,&local_2c58,
             &local_2c78,'\0',0,&local_2ca0,
             (UnixTime)
             gtest_ar__43.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,0x1073);
  std::__cxx11::string::~string((string *)&local_2ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ca1);
  std::__cxx11::string::~string((string *)&local_2c78);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c79);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2c58);
  std::__cxx11::string::~string((string *)&local_2c30);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c31);
  std::__cxx11::string::~string((string *)&local_2c00);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c01);
  std::__cxx11::string::~string((string *)&local_2bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bd9);
  std::__cxx11::string::~string((string *)&local_2bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bb1);
  std::__cxx11::string::~string((string *)&local_2b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b89);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2b68);
  std::__cxx11::string::~string((string *)&local_2b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b49);
  SVar1 = ot::commissioner::persistent_storage::Registry::Add
                    ((Registry *)local_20,(BorderAgent *)local_2b28);
  local_2cc1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2cc0,&local_2cc1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2cc0);
  if (!bVar2) {
    testing::Message::Message(&local_2cd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&new_val_3.mAgent.mPresentFlags,(internal *)local_2cc0,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar3)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2cd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x128,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2cd8,&local_2cd0);
    testing::internal::AssertHelper::~AssertHelper(&local_2cd8);
    std::__cxx11::string::~string((string *)&new_val_3.mAgent.mPresentFlags);
    testing::Message::~Message(&local_2cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2cc0);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            ((BorderRouter *)&gtest_ar__44.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_2e98,0);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    ((Registry *)local_20,local_2e98,(BorderRouter *)&gtest_ar__44.message_);
  local_2e91 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e90,&local_2e91,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e90);
  if (!bVar2) {
    testing::Message::Message(&local_2ea0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__45.message_,(internal *)local_2e90,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2ea8,&local_2ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ea8);
    std::__cxx11::string::~string((string *)&gtest_ar__45.message_);
    testing::Message::~Message(&local_2ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e90);
  local_2ed9 = new_val_3._vptr_BorderRouter._4_4_ == 2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2ed8,&local_2ed9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ed8);
  if (!bVar2) {
    testing::Message::Message(&local_2ee8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk_4.mCcm,(internal *)local_2ed8,
               (AssertionResult *)"new_val.mNetworkId.mId == 2","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2ef0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,299,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2ef0,&local_2ee8);
    testing::internal::AssertHelper::~AssertHelper(&local_2ef0);
    std::__cxx11::string::~string((string *)&nwk_4.mCcm);
    testing::Message::~Message(&local_2ee8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ed8);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar__46.message_);
  SVar1 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    ((Registry *)local_20,(string *)&ba_6.mState,(Network *)&gtest_ar__46.message_);
  local_2f81 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f80,&local_2f81,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f80);
  if (!bVar2) {
    testing::Message::Message(&local_2f90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__47.message_,(internal *)local_2f80,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f98,&local_2f90);
    testing::internal::AssertHelper::~AssertHelper(&local_2f98);
    std::__cxx11::string::~string((string *)&gtest_ar__47.message_);
    testing::Message::~Message(&local_2f90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f80);
  local_2fc9 = gtest_ar__46.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._4_4_ == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2fc8,&local_2fc9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2fc8);
  if (!bVar2) {
    testing::Message::Message(&local_2fd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__48.message_,(internal *)local_2fc8,
               (AssertionResult *)"nwk.mDomainId.mId == 1","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2fe0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2fe0,&local_2fd8);
    testing::internal::AssertHelper::~AssertHelper(&local_2fe0);
    std::__cxx11::string::~string((string *)&gtest_ar__48.message_);
    testing::Message::~Message(&local_2fd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2fc8);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar__46.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
            ((BorderRouter *)&gtest_ar__44.message_);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_2b28);
  SVar1 = ot::commissioner::persistent_storage::Registry::Close((Registry *)local_20);
  local_3011 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3010,&local_3011,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3010);
  if (!bVar2) {
    testing::Message::Message(&local_3020);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3048,(internal *)local_3010,
               (AssertionResult *)"reg.Close() == Registry::Status::kSuccess","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3028,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x131,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3028,&local_3020);
    testing::internal::AssertHelper::~AssertHelper(&local_3028);
    std::__cxx11::string::~string((string *)&local_3048);
    testing::Message::~Message(&local_3020);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3010);
  ot::commissioner::persistent_storage::Registry::~Registry((Registry *)local_20);
  return;
}

Assistant:

TEST(RegJson, CreateBorderRouterFromBorderAgent)
{
    unlink(json_path);
    Registry reg(json_path);

    EXPECT_TRUE(reg.Open() == Registry::Status::kSuccess);

    // Create BorderRouter with network
    {
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net1",
                       0x0101010101010101,
                       "",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter ret_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, ret_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(ret_val.mNetworkId.mId == 0);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByXpan(0, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == EMPTY_ID);
    }

    // Create BorderRouter with network and domain
    {
        BorderAgent ba{"1.1.1.2",
                       2,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net2",
                       0x0202020202020202,
                       "",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom2",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);

        BorderRouter ret_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{1}, ret_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(ret_val.mNetworkId.mId == 1);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mId.mId == 1);
        EXPECT_TRUE(nwk.mDomainId.mId == 0);
        std::string dom;
        EXPECT_TRUE(reg.GetDomainNameByXpan(nwk.mXpan, dom) == Registry::Status::kSuccess);
        EXPECT_TRUE(dom == ba.mDomainName);
    }

    // Fail to create BorderRouter without network
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "",
                       0,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kVendorNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kError);
    }
    // Update BorderRouter fields
    {
        // Check the BorderRouter present
        BorderRouter val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, val) == Registry::Status::kSuccess);
        EXPECT_TRUE((val.mAgent.mPresentFlags & (BorderAgent::kAddrBit | BorderAgent::kPortBit)) ==
                    (BorderAgent::kAddrBit | BorderAgent::kPortBit));
        EXPECT_TRUE(val.mAgent.mAddr == "1.1.1.1");
        INFO(val.mAgent.mNetworkName + " : " + utils::Hex(val.mAgent.mExtendedPanId));
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByXpan(val.mAgent.mExtendedPanId, nwk) == Registry::Status::kSuccess);
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{BorderAgent::State::ConnectionMode::kVendorSpecific,
                                          BorderAgent::State::ThreadInterfaceStatus::kActive,
                                          BorderAgent::State::Availability::kHigh, 0, 0},
                       "net1",
                       0x0101010101010101,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "vendorData",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kStateBit |
                           BorderAgent::kNetworkNameBit | BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit |
                           BorderAgent::kVendorDataBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(val.mId.mId == new_val.mId.mId);
        EXPECT_TRUE(val.mNetworkId.mId == new_val.mNetworkId.mId);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mState.mConnectionMode == ba.mState.mConnectionMode);
        EXPECT_TRUE(new_val.mAgent.mState.mThreadIfStatus == ba.mState.mThreadIfStatus);
        EXPECT_TRUE(new_val.mAgent.mState.mAvailability == ba.mState.mAvailability);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kNetworkNameBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mNetworkName == ba.mNetworkName);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mExtendedPanId == ba.mExtendedPanId);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mVendorName == ba.mVendorName);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mVendorData == ba.mVendorData);
    }

    // Update BorderRouter - switch network
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
    }

    // Update BorderRouter - add network into domain
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom2",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == 0);
    }

    // Update BorderRouter - move network into another domain
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom1", // New domain, will have id == 1
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == 1);
    }

    EXPECT_TRUE(reg.Close() == Registry::Status::kSuccess);
}